

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O2

bool __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::fetch
          (mem_cache<cppcms::impl::process_settings> *this,string *key,string *a,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *triggers,time_t *timeout_out,uint64_t *gen)

{
  iterator pcVar1;
  bool bVar2;
  pointer_list_type *this_00;
  _List_node_base *p_Var3;
  rdlock_guard lock;
  time_t now;
  lock_guard lock_1;
  value_type local_68;
  _Head_base<0UL,_cppcms::impl::shared_mutex_*,_false> local_60;
  long local_58;
  string local_50;
  
  local_60._M_head_impl =
       (this->access_lock)._M_t.
       super___uniq_ptr_impl<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
       ._M_t.
       super__Tuple_impl<0UL,_cppcms::impl::shared_mutex_*,_std::default_delete<cppcms::impl::shared_mutex>_>
       .super__Head_base<0UL,_cppcms::impl::shared_mutex_*,_false>._M_head_impl;
  shared_mutex::rdlock(local_60._M_head_impl);
  time(&local_58);
  pcVar1 = details::
           basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
           ::find<std::__cxx11::string>
                     ((basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>
                       *)&this->primary,key);
  local_68.p_ = pcVar1;
  if ((pcVar1 == (iterator)0x0) || (*(long *)((pcVar1->val).second.timeout._M_node + 1) < local_58))
  {
    bVar2 = false;
  }
  else {
    local_50._M_dataplus._M_p =
         (pointer)(this->lru_mutex)._M_t.
                  super___uniq_ptr_impl<cppcms::impl::mutex,_std::default_delete<cppcms::impl::mutex>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cppcms::impl::mutex_*,_std::default_delete<cppcms::impl::mutex>_>
                  .super__Head_base<0UL,_cppcms::impl::mutex_*,_false>._M_head_impl;
    mutex::lock((mutex *)local_50._M_dataplus._M_p);
    this_00 = &this->lru;
    std::__cxx11::
    list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
    ::erase(this_00,(pcVar1->val).second.lru._M_node);
    std::__cxx11::
    list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
    ::push_front(this_00,&local_68);
    ((local_68.p_)->val).second.lru._M_node =
         (this_00->
         super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    mutex::guard::~guard((guard *)&local_50);
    if (a != (string *)0x0) {
      copy_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_>
      ::to_std(&local_50,&((local_68.p_)->val).second.data);
      std::__cxx11::string::operator=((string *)a,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (triggers !=
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      p_Var3 = (_List_node_base *)&((local_68.p_)->val).second.triggers;
      while (p_Var3 = (((_List_base<_88767e2a_> *)&p_Var3->_M_next)->_M_impl)._M_node.
                      super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&((local_68.p_)->val).second.triggers) {
        copy_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>_>
        ::to_std(&local_50,
                 (basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
                  *)p_Var3[1]._M_next);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)triggers,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if (timeout_out != (time_t *)0x0) {
      *timeout_out = *(time_t *)(((local_68.p_)->val).second.timeout._M_node + 1);
    }
    bVar2 = true;
    if (gen != (uint64_t *)0x0) {
      *gen = ((local_68.p_)->val).second.generation;
    }
  }
  shared_mutex::shared_guard::~shared_guard((shared_guard *)&local_60);
  return bVar2;
}

Assistant:

virtual bool fetch(std::string const &key,std::string *a,std::set<std::string> *triggers,time_t *timeout_out,uint64_t *gen)
	{
		rdlock_guard lock(*access_lock);
		pointer p;
		time_t now;
		time(&now);

		if((p=primary.find(key))==primary.end() || p->second.timeout->first < now) {
			return false;
		}

		{ // Update LRU
			lock_guard lock(*lru_mutex);
			lru.erase(p->second.lru);
			lru.push_front(p);
			p->second.lru=lru.begin();
		}

		if(a)
			*a=to_std(p->second.data);

		if(triggers) {
			typename triggers_list_type::iterator tp;
			for(tp=p->second.triggers.begin();tp!=p->second.triggers.end();tp++) {
				triggers->insert(to_std(tp->first->first));
			}
		}

		if(timeout_out) {
			*timeout_out=p->second.timeout->first;
		}		

		if(gen)
			*gen=p->second.generation;

		return true;
	}